

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

double __thiscall QDoubleSpinBox::valueFromText(QDoubleSpinBox *this,QString *text)

{
  double dVar1;
  long in_FS_OFFSET;
  QDoubleSpinBoxPrivate *d;
  State state;
  int pos;
  QString copy;
  QString *in_stack_00000058;
  QDoubleSpinBoxPrivate *in_stack_00000060;
  QString *in_stack_ffffffffffffff78;
  QLineEdit *in_stack_ffffffffffffff80;
  QVariant *this_00;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDoubleSpinBox *)0x692b50);
  QString::QString((QString *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QLineEdit::cursorPosition(in_stack_ffffffffffffff80);
  this_00 = &local_28;
  QDoubleSpinBoxPrivate::validateAndInterpret
            (in_stack_00000060,in_stack_00000058,(int *)copy.d.size,(State *)copy.d.ptr);
  dVar1 = (double)::QVariant::toDouble((bool *)this_00);
  ::QVariant::~QVariant(this_00);
  QString::~QString((QString *)0x692bec);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return dVar1;
  }
  __stack_chk_fail();
}

Assistant:

double QDoubleSpinBox::valueFromText(const QString &text) const
{
    Q_D(const QDoubleSpinBox);

    QString copy = text;
    int pos = d->edit->cursorPosition();
    QValidator::State state = QValidator::Acceptable;
    return d->validateAndInterpret(copy, pos, state).toDouble();
}